

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_gd.c
# Opt level: O0

gdImagePtr gdImageCreateFromGd(FILE *inFile)

{
  gdIOCtx *in_00;
  gdIOCtx *in;
  gdImagePtr im;
  FILE *inFile_local;
  
  in_00 = gdNewFileCtx(inFile);
  if (in_00 == (gdIOCtx *)0x0) {
    inFile_local = (FILE *)0x0;
  }
  else {
    inFile_local = (FILE *)gdImageCreateFromGdCtx(in_00);
    (*in_00->gd_free)(in_00);
  }
  return (gdImagePtr)inFile_local;
}

Assistant:

BGD_DECLARE(gdImagePtr) gdImageCreateFromGd (FILE * inFile)
{
	gdImagePtr im;
	gdIOCtx *in;

	in = gdNewFileCtx (inFile);
	if (in == NULL) return NULL;
	im = gdImageCreateFromGdCtx (in);

	in->gd_free (in);

	return im;
}